

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ceiling.cpp
# Opt level: O0

bool P_CreateCeiling(sector_t *sec,ECeiling type,line_t *line,int tag,double speed,double speed2,
                    double height,int crush,int silent,int change,ECrushMode hexencrush)

{
  DCeiling *pDVar1;
  bool bVar2;
  FTextureID FVar3;
  uint uVar4;
  DCeiling *this;
  size_t len;
  double dVar5;
  double dVar6;
  sector_t *local_d0;
  sector_t *modelsec;
  double movedist;
  double diff;
  vertex_t *spot;
  DCeiling *local_60;
  DCeiling *ceiling;
  double targheight;
  int silent_local;
  int crush_local;
  double height_local;
  double speed2_local;
  double speed_local;
  line_t *plStack_28;
  int tag_local;
  line_t *line_local;
  sector_t *psStack_18;
  ECeiling type_local;
  sector_t *sec_local;
  
  ceiling = (DCeiling *)0x0;
  len = 1;
  targheight._0_4_ = silent;
  targheight._4_4_ = crush;
  _silent_local = (DCeiling *)height;
  height_local = speed2;
  speed2_local = speed;
  speed_local._4_4_ = tag;
  plStack_28 = line;
  line_local._4_4_ = type;
  psStack_18 = sec;
  bVar2 = sector_t::PlaneMoving(sec,1);
  if (bVar2) {
    sec_local._7_1_ = false;
  }
  else {
    this = (DCeiling *)DObject::operator_new((DObject *)0xa8,len);
    DCeiling::DCeiling(this,psStack_18,speed2_local,height_local,targheight._0_4_ & 0xfffffffb);
    pDVar1 = _silent_local;
    diff = (double)(*psStack_18->lines)->v1;
    local_60 = this;
    switch(line_local._4_4_) {
    case ceilLowerByValue:
      dVar5 = secplane_t::ZatPoint(&psStack_18->ceilingplane,(vertex_t *)diff);
      ceiling = (DCeiling *)(dVar5 - (double)_silent_local);
      dVar5 = secplane_t::PointToDist(&psStack_18->ceilingplane,(vertex_t *)diff,(double)ceiling);
      local_60->m_BottomHeight = dVar5;
      local_60->m_Direction = -1;
      break;
    case ceilRaiseByValue:
      dVar5 = secplane_t::ZatPoint(&psStack_18->ceilingplane,(vertex_t *)diff);
      ceiling = (DCeiling *)(dVar5 + (double)_silent_local);
      dVar5 = secplane_t::PointToDist(&psStack_18->ceilingplane,(vertex_t *)diff,(double)ceiling);
      local_60->m_TopHeight = dVar5;
      local_60->m_Direction = 1;
      break;
    case ceilMoveToValue:
      dVar5 = secplane_t::ZatPoint(&psStack_18->ceilingplane,(vertex_t *)diff);
      ceiling = _silent_local;
      if (0.0 <= (double)pDVar1 - dVar5) {
        dVar5 = secplane_t::PointToDist
                          (&psStack_18->ceilingplane,(vertex_t *)diff,(double)_silent_local);
        local_60->m_TopHeight = dVar5;
        local_60->m_Direction = 1;
      }
      else {
        dVar5 = secplane_t::PointToDist
                          (&psStack_18->ceilingplane,(vertex_t *)diff,(double)_silent_local);
        local_60->m_BottomHeight = dVar5;
        local_60->m_Direction = -1;
      }
      break;
    case ceilLowerToHighestFloor:
      dVar5 = sector_t::FindHighestFloorSurrounding(psStack_18,(vertex_t **)&diff);
      ceiling = (DCeiling *)(dVar5 + (double)_silent_local);
      dVar5 = secplane_t::PointToDist(&psStack_18->ceilingplane,(vertex_t *)diff,(double)ceiling);
      local_60->m_BottomHeight = dVar5;
      local_60->m_Direction = -1;
      break;
    case ceilLowerInstant:
      dVar5 = secplane_t::ZatPoint(&psStack_18->ceilingplane,(vertex_t *)diff);
      ceiling = (DCeiling *)(dVar5 - (double)_silent_local);
      dVar5 = secplane_t::PointToDist(&psStack_18->ceilingplane,(vertex_t *)diff,(double)ceiling);
      local_60->m_BottomHeight = dVar5;
      local_60->m_Direction = -1;
      local_60->m_Speed = (double)_silent_local;
      break;
    case ceilRaiseInstant:
      dVar5 = secplane_t::ZatPoint(&psStack_18->ceilingplane,(vertex_t *)diff);
      ceiling = (DCeiling *)(dVar5 + (double)_silent_local);
      dVar5 = secplane_t::PointToDist(&psStack_18->ceilingplane,(vertex_t *)diff,(double)ceiling);
      local_60->m_TopHeight = dVar5;
      local_60->m_Direction = 1;
      local_60->m_Speed = (double)_silent_local;
      break;
    case ceilCrushAndRaise:
    case ceilCrushRaiseAndStay:
      dVar5 = secplane_t::fD(&psStack_18->ceilingplane);
      local_60->m_TopHeight = dVar5;
    case ceilLowerAndCrush:
      dVar5 = sector_t::FindHighestFloorPoint(psStack_18,(vertex_t **)&diff);
      ceiling = (DCeiling *)((double)_silent_local + dVar5);
      dVar5 = secplane_t::PointToDist(&psStack_18->ceilingplane,(vertex_t *)diff,(double)ceiling);
      local_60->m_BottomHeight = dVar5;
      local_60->m_Direction = -1;
      break;
    default:
      break;
    case ceilRaiseToNearest:
      ceiling = (DCeiling *)sector_t::FindNextHighestCeiling(psStack_18,(vertex_t **)&diff);
      dVar5 = secplane_t::PointToDist(&psStack_18->ceilingplane,(vertex_t *)diff,(double)ceiling);
      local_60->m_TopHeight = dVar5;
      local_60->m_Direction = 1;
      break;
    case ceilLowerToLowest:
      ceiling = (DCeiling *)sector_t::FindLowestCeilingSurrounding(psStack_18,(vertex_t **)&diff);
      dVar5 = secplane_t::PointToDist(&psStack_18->ceilingplane,(vertex_t *)diff,(double)ceiling);
      local_60->m_BottomHeight = dVar5;
      local_60->m_Direction = -1;
      break;
    case ceilLowerToFloor:
      dVar5 = sector_t::FindHighestFloorPoint(psStack_18,(vertex_t **)&diff);
      ceiling = (DCeiling *)(dVar5 + (double)_silent_local);
      dVar5 = secplane_t::PointToDist(&psStack_18->ceilingplane,(vertex_t *)diff,(double)ceiling);
      local_60->m_BottomHeight = dVar5;
      local_60->m_Direction = -1;
      break;
    case ceilRaiseToHighest:
      ceiling = (DCeiling *)sector_t::FindHighestCeilingSurrounding(psStack_18,(vertex_t **)&diff);
      dVar5 = secplane_t::PointToDist(&psStack_18->ceilingplane,(vertex_t *)diff,(double)ceiling);
      local_60->m_TopHeight = dVar5;
      local_60->m_Direction = 1;
      break;
    case ceilLowerToHighest:
      ceiling = (DCeiling *)sector_t::FindHighestCeilingSurrounding(psStack_18,(vertex_t **)&diff);
      dVar5 = secplane_t::PointToDist(&psStack_18->ceilingplane,(vertex_t *)diff,(double)ceiling);
      local_60->m_BottomHeight = dVar5;
      local_60->m_Direction = -1;
      break;
    case ceilRaiseToLowest:
      ceiling = (DCeiling *)sector_t::FindLowestCeilingSurrounding(psStack_18,(vertex_t **)&diff);
      dVar5 = secplane_t::PointToDist(&psStack_18->ceilingplane,(vertex_t *)diff,(double)ceiling);
      local_60->m_TopHeight = dVar5;
      local_60->m_Direction = 1;
      break;
    case ceilLowerToNearest:
      ceiling = (DCeiling *)sector_t::FindNextLowestCeiling(psStack_18,(vertex_t **)&diff);
      dVar5 = secplane_t::PointToDist(&psStack_18->ceilingplane,(vertex_t *)diff,(double)ceiling);
      local_60->m_BottomHeight = dVar5;
      local_60->m_Direction = -1;
      break;
    case ceilRaiseToHighestFloor:
      ceiling = (DCeiling *)sector_t::FindHighestFloorSurrounding(psStack_18,(vertex_t **)&diff);
      dVar5 = secplane_t::PointToDist(&psStack_18->ceilingplane,(vertex_t *)diff,(double)ceiling);
      local_60->m_TopHeight = dVar5;
      local_60->m_Direction = 1;
      break;
    case ceilRaiseToFloor:
      dVar5 = sector_t::FindHighestFloorPoint(psStack_18,(vertex_t **)&diff);
      ceiling = (DCeiling *)(dVar5 + (double)_silent_local);
      dVar5 = secplane_t::PointToDist(&psStack_18->ceilingplane,(vertex_t *)diff,(double)ceiling);
      local_60->m_TopHeight = dVar5;
      local_60->m_Direction = 1;
      break;
    case ceilRaiseByTexture:
      dVar5 = secplane_t::ZatPoint(&psStack_18->ceilingplane,(vertex_t *)diff);
      dVar6 = sector_t::FindShortestUpperAround(psStack_18);
      ceiling = (DCeiling *)(dVar5 + dVar6);
      dVar5 = secplane_t::PointToDist(&psStack_18->ceilingplane,(vertex_t *)diff,(double)ceiling);
      local_60->m_TopHeight = dVar5;
      local_60->m_Direction = 1;
      break;
    case ceilLowerByTexture:
      dVar5 = secplane_t::ZatPoint(&psStack_18->ceilingplane,(vertex_t *)diff);
      dVar6 = sector_t::FindShortestUpperAround(psStack_18);
      ceiling = (DCeiling *)(dVar5 - dVar6);
      dVar5 = secplane_t::PointToDist(&psStack_18->ceilingplane,(vertex_t *)diff,(double)ceiling);
      local_60->m_BottomHeight = dVar5;
      local_60->m_Direction = -1;
    }
    local_60->m_Tag = speed_local._4_4_;
    local_60->m_Type = line_local._4_4_;
    local_60->m_Crush = targheight._4_4_;
    local_60->m_CrushMode = hexencrush;
    if (local_60->m_Direction < 0) {
      dVar5 = secplane_t::fD(&psStack_18->ceilingplane);
      modelsec = (sector_t *)(dVar5 - local_60->m_BottomHeight);
    }
    else {
      dVar5 = local_60->m_TopHeight;
      dVar6 = secplane_t::fD(&psStack_18->ceilingplane);
      modelsec = (sector_t *)(dVar5 - dVar6);
    }
    if (((double)modelsec <= local_60->m_Speed) &&
       (DMover::StopInterpolation((DMover *)local_60,true), (targheight._0_4_ & 4) != 0)) {
      local_60->m_Silent = 2;
    }
    if ((change & 3U) != 0) {
      if ((change & 4U) == 0) {
        if (plStack_28 != (line_t *)0x0) {
          FVar3 = sector_t::GetTexture(plStack_28->frontsector,1);
          (local_60->m_Texture).texnum = FVar3.texnum;
          uVar4 = change & 3;
          if (uVar4 == 1) {
            secspecial_t::Clear(&local_60->m_NewSpecial);
            local_60->m_Type = genCeilingChg0;
          }
          else if (uVar4 == 2) {
            sector_t::GetSpecial(plStack_28->frontsector,&local_60->m_NewSpecial);
            local_60->m_Type = genCeilingChgT;
          }
          else if (uVar4 == 3) {
            local_60->m_Type = genCeilingChg;
          }
        }
      }
      else {
        if ((line_local._4_4_ == ceilRaiseToFloor) || (line_local._4_4_ == ceilLowerToFloor)) {
          local_d0 = sector_t::FindModelFloorSector(psStack_18,(double)ceiling);
        }
        else {
          local_d0 = sector_t::FindModelCeilingSector(psStack_18,(double)ceiling);
        }
        if (local_d0 != (sector_t *)0x0) {
          FVar3 = sector_t::GetTexture(local_d0,1);
          (local_60->m_Texture).texnum = FVar3.texnum;
          uVar4 = change & 3;
          if (uVar4 == 1) {
            secspecial_t::Clear(&local_60->m_NewSpecial);
            local_60->m_Type = genCeilingChg0;
          }
          else if (uVar4 == 2) {
            sector_t::GetSpecial(psStack_18,&local_60->m_NewSpecial);
            local_60->m_Type = genCeilingChgT;
          }
          else if (uVar4 == 3) {
            local_60->m_Type = genCeilingChg;
          }
        }
      }
    }
    DCeiling::PlayCeilingSound(local_60);
    sec_local._7_1_ = local_60 != (DCeiling *)0x0;
  }
  return sec_local._7_1_;
}

Assistant:

bool P_CreateCeiling(sector_t *sec, DCeiling::ECeiling type, line_t *line, int tag, 
				   double speed, double speed2, double height,
				   int crush, int silent, int change, DCeiling::ECrushMode hexencrush)
{
	double		targheight = 0;	// Silence, GCC

	// if ceiling already moving, don't start a second function on it
	if (sec->PlaneMoving(sector_t::ceiling))
	{
		return false;
	}
	
	// new door thinker
	DCeiling *ceiling = new DCeiling (sec, speed, speed2, silent & ~4);
	vertex_t *spot = sec->lines[0]->v1;

	switch (type)
	{
	case DCeiling::ceilCrushAndRaise:
	case DCeiling::ceilCrushRaiseAndStay:
		ceiling->m_TopHeight = sec->ceilingplane.fD();
	case DCeiling::ceilLowerAndCrush:
		targheight = sec->FindHighestFloorPoint (&spot);
		targheight += height;
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		break;

	case DCeiling::ceilRaiseToHighest:
		targheight = sec->FindHighestCeilingSurrounding (&spot);
		ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = 1;
		break;

	case DCeiling::ceilLowerByValue:
		targheight = sec->ceilingplane.ZatPoint (spot) - height;
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		break;

	case DCeiling::ceilRaiseByValue:
		targheight = sec->ceilingplane.ZatPoint (spot) + height;
		ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = 1;
		break;

	case DCeiling::ceilMoveToValue:
		{
			double diff = height - sec->ceilingplane.ZatPoint (spot);

			targheight = height;
			if (diff < 0)
			{
				ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, height);
				ceiling->m_Direction = -1;
			}
			else
			{
				ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, height);
				ceiling->m_Direction = 1;
			}
		}
		break;

	case DCeiling::ceilLowerToHighestFloor:
		targheight = sec->FindHighestFloorSurrounding (&spot) + height;
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		break;

	case DCeiling::ceilRaiseToHighestFloor:
		targheight = sec->FindHighestFloorSurrounding (&spot);
		ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = 1;
		break;

	case DCeiling::ceilLowerInstant:
		targheight = sec->ceilingplane.ZatPoint (spot) - height;
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		ceiling->m_Speed = height;
		break;

	case DCeiling::ceilRaiseInstant:
		targheight = sec->ceilingplane.ZatPoint (spot) + height;
		ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = 1;
		ceiling->m_Speed = height;
		break;

	case DCeiling::ceilLowerToNearest:
		targheight = sec->FindNextLowestCeiling (&spot);
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		break;

	case DCeiling::ceilRaiseToNearest:
		targheight = sec->FindNextHighestCeiling (&spot);
		ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = 1;
		break;

	case DCeiling::ceilLowerToLowest:
		targheight = sec->FindLowestCeilingSurrounding (&spot);
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		break;

	case DCeiling::ceilRaiseToLowest:
		targheight = sec->FindLowestCeilingSurrounding (&spot);
		ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = 1;
		break;

	case DCeiling::ceilLowerToFloor:
		targheight = sec->FindHighestFloorPoint (&spot) + height;
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		break;

	case DCeiling::ceilRaiseToFloor:	// [RH] What's this for?
		targheight = sec->FindHighestFloorPoint (&spot) + height;
		ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = 1;
		break;

	case DCeiling::ceilLowerToHighest:
		targheight = sec->FindHighestCeilingSurrounding (&spot);
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		break;

	case DCeiling::ceilLowerByTexture:
		targheight = sec->ceilingplane.ZatPoint (spot) - sec->FindShortestUpperAround ();
		ceiling->m_BottomHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = -1;
		break;

	case DCeiling::ceilRaiseByTexture:
		targheight = sec->ceilingplane.ZatPoint (spot) + sec->FindShortestUpperAround ();
		ceiling->m_TopHeight = sec->ceilingplane.PointToDist (spot, targheight);
		ceiling->m_Direction = 1;
		break;

	default:
		break;	// Silence GCC
	}
			
	ceiling->m_Tag = tag;
	ceiling->m_Type = type;
	ceiling->m_Crush = crush;
	ceiling->m_CrushMode = hexencrush;

	// Do not interpolate instant movement ceilings.
	// Note for ZDoomGL: Check to make sure that you update the sector
	// after the ceiling moves, because it hasn't actually moved yet.
	double movedist;

	if (ceiling->m_Direction < 0)
	{
		movedist = sec->ceilingplane.fD() - ceiling->m_BottomHeight;
	}
	else
	{
		movedist = ceiling->m_TopHeight - sec->ceilingplane.fD();
	}
	if (ceiling->m_Speed >= movedist)
	{
		ceiling->StopInterpolation(true);
		if (silent & 4) ceiling->m_Silent = 2;
	}

	// set texture/type change properties
	if (change & 3)		// if a texture change is indicated
	{
		if (change & 4)	// if a numeric model change
		{
			sector_t *modelsec;

			//jff 5/23/98 find model with floor at target height if target
			//is a floor type
			modelsec = (/*type == ceilRaiseToHighest ||*/
				   type == DCeiling::ceilRaiseToFloor ||
				   /*type == ceilLowerToHighest ||*/
				   type == DCeiling::ceilLowerToFloor) ?
				sec->FindModelFloorSector (targheight) :
				sec->FindModelCeilingSector (targheight);
			if (modelsec != NULL)
			{
				ceiling->m_Texture = modelsec->GetTexture(sector_t::ceiling);
				switch (change & 3)
				{
					case 1:		// type is zeroed
						ceiling->m_NewSpecial.Clear();
						ceiling->m_Type = DCeiling::genCeilingChg0;
						break;
					case 2:		// type is copied
						sec->GetSpecial(&ceiling->m_NewSpecial);
						ceiling->m_Type = DCeiling::genCeilingChgT;
						break;
					case 3:		// type is left alone
						ceiling->m_Type = DCeiling::genCeilingChg;
						break;
				}
			}
		}
		else if (line)	// else if a trigger model change
		{
			ceiling->m_Texture = line->frontsector->GetTexture(sector_t::ceiling);
			switch (change & 3)
			{
				case 1:		// type is zeroed
					ceiling->m_NewSpecial.Clear();
					ceiling->m_Type = DCeiling::genCeilingChg0;
					break;
				case 2:		// type is copied
					line->frontsector->GetSpecial(&ceiling->m_NewSpecial);
					ceiling->m_Type = DCeiling::genCeilingChgT;
					break;
				case 3:		// type is left alone
					ceiling->m_Type = DCeiling::genCeilingChg;
					break;
			}
		}
	}

	ceiling->PlayCeilingSound ();
	return ceiling != NULL;
}